

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O3

bool __thiscall
Js::ProbeContainer::InitializeLocation
          (ProbeContainer *this,InterpreterHaltState *pHaltState,bool fMatchWithCurrentScriptContext
          )

{
  int iVar1;
  DiagStackFrame *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ReferencedArenaAdapter *pRVar5;
  StringBuilder<Memory::ArenaAllocator> *pSVar6;
  DiagStackFrame **ppDVar7;
  DebugManager *this_01;
  ArenaAllocator *alloc;
  
  this_01 = this->debugManager;
  if (this_01 == (DebugManager *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0xc5,"(debugManager)","debugManager");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    this_01 = this->debugManager;
  }
  DebugManager::SetCurrentInterpreterLocation(this_01,pHaltState);
  pRVar5 = DebugManager::GetDiagnosticArena(this->debugManager);
  alloc = (ArenaAllocator *)0x0;
  if (pRVar5->deleteFlag == false) {
    alloc = pRVar5->arena;
  }
  UpdateFramePointers(this,fMatchWithCurrentScriptContext,0);
  pHaltState->framePointers = this->framePointers;
  pSVar6 = (StringBuilder<Memory::ArenaAllocator> *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470)
  ;
  pSVar6->alloc = alloc;
  pSVar6->firstChunk = (Data *)0x0;
  pSVar6->secondChunk = (Data *)0x0;
  pSVar6->appendPtr = (char16 *)0x0;
  pSVar6->length = 0;
  pSVar6->count = 0;
  pSVar6->initialSize = 0;
  pHaltState->stringBuilder = pSVar6;
  iVar1 = ((ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer> *)
          pHaltState->framePointers)->count;
  if (0 < iVar1) {
    ppDVar7 = JsUtil::ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>::
              Item((ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer> *)
                   pHaltState->framePointers,iVar1 + -1);
    this_00 = *ppDVar7;
    pHaltState->topFrame = this_00;
    DiagStackFrame::SetIsTopFrame(this_00);
  }
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::InitializeLocation (end): this=%p, pHaltState=%p, fMatch=%d, topFrame=%p\n"
                ,this,pHaltState,(ulong)fMatchWithCurrentScriptContext,pHaltState->topFrame);
  return true;
}

Assistant:

bool ProbeContainer::InitializeLocation(InterpreterHaltState* pHaltState, bool fMatchWithCurrentScriptContext)
    {
        Assert(debugManager);
        debugManager->SetCurrentInterpreterLocation(pHaltState);

        ArenaAllocator* pDiagArena = debugManager->GetDiagnosticArena()->Arena();

        UpdateFramePointers(fMatchWithCurrentScriptContext);
        pHaltState->framePointers = framePointers;
        pHaltState->stringBuilder = Anew(pDiagArena, StringBuilder<ArenaAllocator>, pDiagArena);

        if (pHaltState->framePointers->Count() > 0)
        {
            pHaltState->topFrame = pHaltState->framePointers->Peek(0);
            pHaltState->topFrame->SetIsTopFrame();
        }

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::InitializeLocation (end): this=%p, pHaltState=%p, fMatch=%d, topFrame=%p\n"),
            this, pHaltState, fMatchWithCurrentScriptContext, pHaltState->topFrame);

        return true;
    }